

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O0

int timeOffsetUTC(void)

{
  time_t __time1;
  time_t __time0;
  double dVar1;
  tm gbuf;
  time_t rawtime;
  time_t gmt;
  time_t *in_stack_ffffffffffffffa8;
  tm *in_stack_ffffffffffffffb0;
  int local_4;
  
  if (timeOffsetUTC::cachedOffset < -0x7fffffff) {
    __time1 = time((time_t *)0x0);
    gmtime_s(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    __time0 = mktime((tm *)&stack0xffffffffffffffb0);
    dVar1 = difftime(__time1,__time0);
    local_4 = (int)dVar1;
  }
  else {
    local_4 = timeOffsetUTC::cachedOffset;
  }
  timeOffsetUTC::cachedOffset = local_4;
  return local_4;
}

Assistant:

int timeOffsetUTC()
{
    static int cachedOffset = INT_MIN;

    if (cachedOffset > INT_MIN)
        return cachedOffset;
    else {
        time_t gmt, rawtime = time(NULL);
        struct tm gbuf;
        gmtime_s(&gbuf, &rawtime);

        // Request that mktime() looks up dst in timezone database
        gbuf.tm_isdst = -1;
        gmt = mktime(&gbuf);

        return cachedOffset = (int)difftime(rawtime, gmt);
    }
}